

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

bool TestHashList<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes,bool drawDiagram,
               bool testCollision,bool testDist,bool testHighBits,bool testLowBits)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  size_type sVar10;
  reference pvVar11;
  uint in_ECX;
  uint in_EDX;
  undefined4 in_ESI;
  int iVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint in_R8D;
  byte in_R9B;
  double dVar13;
  double dVar14;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> revhashes;
  HashSet<unsigned_int> collisions;
  double collcount;
  double expected;
  size_t count;
  bool result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffef8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  int in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff29;
  undefined1 in_stack_ffffffffffffff2a;
  undefined1 in_stack_ffffffffffffff2b;
  uint uVar15;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff50;
  ulong local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  undefined1 local_58 [15];
  undefined1 in_stack_ffffffffffffffb7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb8;
  bool local_e;
  
  uVar2 = in_ECX & 1;
  uVar1 = in_R8D & 1;
  local_e = true;
  if ((in_EDX & 1) != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
    uVar15 = 0x20;
    dVar13 = EstimateNbCollisions(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
    printf("Testing collisions (%3i-bit)     - Expected %12.1f, ",dVar13,(ulong)uVar15);
    iVar12 = (int)((ulong)local_58 >> 0x20);
    HashSet<unsigned_int>::HashSet((HashSet<unsigned_int> *)0x133603);
    iVar9 = FindCollisions<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       CONCAT44(in_ECX,in_R8D),
                       (HashSet<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),iVar12);
    dVar14 = (double)iVar9;
    printf("actual %6i (%.2fx)",dVar14 / dVar13,CONCAT44(iVar12,(int)dVar14));
    local_e = 2.0 < dVar14 / dVar13;
    if (local_e) {
      printf(" !!!!!");
    }
    local_e = !local_e;
    printf("\n");
    if (uVar1 != 0) {
      in_stack_ffffffffffffff2b =
           CountHighbitsCollisions<unsigned_int>
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(uVar15,CONCAT13(in_stack_ffffffffffffff2b,
                                               CONCAT12(in_stack_ffffffffffffff2a,
                                                        CONCAT11(in_stack_ffffffffffffff29,
                                                                 in_stack_ffffffffffffff28)))),
                      in_stack_ffffffffffffff24);
      local_e = (bool)in_stack_ffffffffffffff2b && local_e;
      in_stack_ffffffffffffff2a =
           CountHighbitsCollisions<unsigned_int>
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(uVar15,CONCAT13(in_stack_ffffffffffffff2b,
                                               CONCAT12(in_stack_ffffffffffffff2a,
                                                        CONCAT11(in_stack_ffffffffffffff29,
                                                                 in_stack_ffffffffffffff28)))),
                      in_stack_ffffffffffffff24);
      local_e = (bool)in_stack_ffffffffffffff2a && local_e;
      in_stack_ffffffffffffff29 =
           CountHighbitsCollisions<unsigned_int>
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(uVar15,CONCAT13(in_stack_ffffffffffffff2b,
                                               CONCAT12(in_stack_ffffffffffffff2a,
                                                        CONCAT11(in_stack_ffffffffffffff29,
                                                                 in_stack_ffffffffffffff28)))),
                      in_stack_ffffffffffffff24);
      local_e = (bool)in_stack_ffffffffffffff29 && local_e;
      in_stack_ffffffffffffff28 =
           CountHighbitsCollisions<unsigned_int>
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(uVar15,CONCAT13(in_stack_ffffffffffffff2b,
                                               CONCAT12(in_stack_ffffffffffffff2a,
                                                        CONCAT11(in_stack_ffffffffffffff29,
                                                                 in_stack_ffffffffffffff28)))),
                      in_stack_ffffffffffffff24);
      local_e = (bool)in_stack_ffffffffffffff28 && local_e;
      bVar3 = TestHighbitsCollisions<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(iVar9,in_stack_ffffffffffffff38));
      iVar12 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff24);
      bVar4 = CountHighbitsCollisions<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(uVar15,CONCAT13(in_stack_ffffffffffffff2b,
                                                  CONCAT12(in_stack_ffffffffffffff2a,
                                                           CONCAT11(in_stack_ffffffffffffff29,
                                                                    in_stack_ffffffffffffff28)))),
                         iVar12);
      iVar12 = CONCAT13((char)((uint)iVar12 >> 0x18),CONCAT12(bVar4,(short)iVar12));
      bVar5 = CountHighbitsCollisions<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(uVar15,CONCAT13(in_stack_ffffffffffffff2b,
                                                  CONCAT12(in_stack_ffffffffffffff2a,
                                                           CONCAT11(in_stack_ffffffffffffff29,
                                                                    in_stack_ffffffffffffff28)))),
                         iVar12);
      in_stack_ffffffffffffff24 =
           CONCAT22((short)((uint)iVar12 >> 0x10),CONCAT11(bVar5,(char)iVar12));
      local_e = (bVar4 && (bVar3 && local_e)) && bVar5;
    }
    if ((in_R9B & 1) != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (in_stack_ffffffffffffff50,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(in_ESI,in_EDX));
      local_88 = 0;
      while( true ) {
        sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_80);
        if (sVar10 <= local_88) break;
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_80,local_88);
        in_stack_ffffffffffffff14 = bitreverse<unsigned_int>(*pvVar11,0x20);
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_80,local_88);
        *pvVar11 = in_stack_ffffffffffffff14;
        local_88 = local_88 + 1;
      }
      __last._M_current = (uint *)&local_80;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_fffffffffffffef8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_fffffffffffffef8);
      __first._M_current._4_4_ = in_stack_ffffffffffffff14;
      __first._M_current._0_4_ = in_stack_ffffffffffffff10;
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (__first,__last);
      bVar3 = CountLowbitsCollisions<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(uVar15,CONCAT13(in_stack_ffffffffffffff2b,
                                                  CONCAT12(in_stack_ffffffffffffff2a,
                                                           CONCAT11(in_stack_ffffffffffffff29,
                                                                    in_stack_ffffffffffffff28)))),
                         in_stack_ffffffffffffff24);
      bVar4 = CountLowbitsCollisions<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(uVar15,CONCAT13(in_stack_ffffffffffffff2b,
                                                  CONCAT12(in_stack_ffffffffffffff2a,
                                                           CONCAT11(in_stack_ffffffffffffff29,
                                                                    in_stack_ffffffffffffff28)))),
                         in_stack_ffffffffffffff24);
      bVar5 = CountLowbitsCollisions<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(uVar15,CONCAT13(in_stack_ffffffffffffff2b,
                                                  CONCAT12(in_stack_ffffffffffffff2a,
                                                           CONCAT11(in_stack_ffffffffffffff29,
                                                                    in_stack_ffffffffffffff28)))),
                         in_stack_ffffffffffffff24);
      bVar6 = TestLowbitsCollisions<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(iVar9,in_stack_ffffffffffffff38));
      bVar7 = CountLowbitsCollisions<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(uVar15,CONCAT13(in_stack_ffffffffffffff2b,
                                                  CONCAT12(in_stack_ffffffffffffff2a,
                                                           CONCAT11(in_stack_ffffffffffffff29,
                                                                    in_stack_ffffffffffffff28)))),
                         in_stack_ffffffffffffff24);
      bVar8 = CountLowbitsCollisions<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(uVar15,CONCAT13(in_stack_ffffffffffffff2b,
                                                  CONCAT12(in_stack_ffffffffffffff2a,
                                                           CONCAT11(in_stack_ffffffffffffff29,
                                                                    in_stack_ffffffffffffff28)))),
                         in_stack_ffffffffffffff24);
      local_e = (bVar7 & bVar6 & bVar5 & bVar4 & bVar3 & local_e & bVar8) != 0;
      memset(&stack0xffffffffffffff50,0,0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x133a8c);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__last._M_current);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    }
    HashSet<unsigned_int>::~HashSet((HashSet<unsigned_int> *)0x133ac2);
  }
  if (uVar2 != 0) {
    bVar3 = TestDistribution<unsigned_int>
                      (in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
    local_e = (local_e & bVar3) != 0;
  }
  return local_e;
}

Assistant:

bool TestHashList ( std::vector<hashtype> & hashes, bool drawDiagram,
                    bool testCollision = true, bool testDist = true,
                    bool testHighBits = true, bool testLowBits = true )
{
  bool result = true;

  if(testCollision)
  {
    size_t count = hashes.size();
    double expected = EstimateNbCollisions(count, sizeof(hashtype) * 8);
    printf("Testing collisions (%3i-bit)     - Expected %12.1f, ",
           (int)sizeof(hashtype)*8, expected);

    double collcount = 0;
    HashSet<hashtype> collisions;
    collcount = FindCollisions(hashes, collisions, 1000);
    printf("actual %6i (%.2fx)", (int)collcount, collcount / expected);

    if(sizeof(hashtype) == sizeof(uint32_t))
    {
    // 2x expected collisions = fail

    // #TODO - collision failure cutoff needs to be expressed as a standard deviation instead
    // of a scale factor, otherwise we fail erroneously if there are a small expected number
    // of collisions

        if(double(collcount) / double(expected) > 2.0)
        {
          printf(" !!!!!");
          result = false;
        }
    }
    else
    {
      // For all hashes larger than 32 bits, _any_ collisions are a failure.

      if(collcount > 0)
      {
        printf(" !!!!!");
        result = false;
        //if(drawDiagram) PrintCollisions(hashes, collisions);
      }
    }

    printf("\n");

    if (testHighBits) {
      result &= CountHighbitsCollisions(hashes, 256);
      result &= CountHighbitsCollisions(hashes, 128);
      result &= CountHighbitsCollisions(hashes,  64);
      result &= CountHighbitsCollisions(hashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountHighbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestHighbitsCollisions(hashes);
      result &= CountHighbitsCollisions(hashes,   12);
      result &= CountHighbitsCollisions(hashes,   8);
    }
    if (testLowBits) {
      // reverse: bitwise flip the hashes. lowest bits first
      std::vector<hashtype> revhashes = hashes;
      for (size_t i = 0; i < revhashes.size(); i++) {
        revhashes[i] = bitreverse(revhashes[i]);
      }
      std::sort(revhashes.begin(), revhashes.end());

      result &= CountLowbitsCollisions(revhashes, 128);
      result &= CountLowbitsCollisions(revhashes,  64);
      result &= CountLowbitsCollisions(revhashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountLowbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestLowbitsCollisions(revhashes);
      result &= CountLowbitsCollisions(revhashes,   12);
      result &= CountLowbitsCollisions(revhashes,   8);

      std::vector<hashtype>().swap(revhashes);
      //revhashes.clear();
    }
  }


  //----------

  if(testDist)
  {
    result &= TestDistribution(hashes,drawDiagram);
  }

  return result;
}